

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt_GetGlyphBitmapBoxSubpixel
               (stbtt_fontinfo *font,int glyph,float scale_x,float scale_y,float shift_x,
               float shift_y,int *ix0,int *iy0,int *ix1,int *iy1)

{
  int iVar1;
  int *in_RCX;
  stbtt_fontinfo *in_RDX;
  int *in_R8;
  int *in_R9;
  float in_XMM0_Da;
  float fVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  int y1;
  int x1;
  int y0;
  int x0;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  iVar3 = 0;
  iVar1 = stbtt_GetGlyphBox(in_RDX,(int)((ulong)in_RCX >> 0x20),in_R8,in_R9,(int *)0x0,
                            (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (iVar1 == 0) {
    if (in_RDX != (stbtt_fontinfo *)0x0) {
      *(undefined4 *)&in_RDX->userdata = 0;
    }
    if (in_RCX != (int *)0x0) {
      *in_RCX = 0;
    }
    if (in_R8 != (int *)0x0) {
      *in_R8 = 0;
    }
    if (in_R9 != (int *)0x0) {
      *in_R9 = 0;
    }
  }
  else {
    if (in_RDX != (stbtt_fontinfo *)0x0) {
      fVar2 = floorf((float)iVar4 * in_XMM0_Da + in_XMM2_Da);
      *(int *)&in_RDX->userdata = (int)fVar2;
    }
    if (in_RCX != (int *)0x0) {
      fVar2 = floorf((float)-in_stack_ffffffffffffffb0 * in_XMM1_Da + in_XMM3_Da);
      *in_RCX = (int)fVar2;
    }
    if (in_R8 != (int *)0x0) {
      fVar2 = ceilf((float)in_stack_ffffffffffffffb4 * in_XMM0_Da + in_XMM2_Da);
      *in_R8 = (int)fVar2;
    }
    if (in_R9 != (int *)0x0) {
      fVar2 = ceilf((float)-iVar3 * in_XMM1_Da + in_XMM3_Da);
      *in_R9 = (int)fVar2;
    }
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_GetGlyphBitmapBoxSubpixel(const stbtt_fontinfo *font, int glyph, float scale_x, float scale_y,float shift_x, float shift_y, int *ix0, int *iy0, int *ix1, int *iy1)
{
   int x0=0,y0=0,x1,y1; // =0 suppresses compiler warning
   if (!stbtt_GetGlyphBox(font, glyph, &x0,&y0,&x1,&y1)) {
      // e.g. space character
      if (ix0) *ix0 = 0;
      if (iy0) *iy0 = 0;
      if (ix1) *ix1 = 0;
      if (iy1) *iy1 = 0;
   } else {
      // move to integral bboxes (treating pixels as little squares, what pixels get touched)?
      if (ix0) *ix0 = STBTT_ifloor( x0 * scale_x + shift_x);
      if (iy0) *iy0 = STBTT_ifloor(-y1 * scale_y + shift_y);
      if (ix1) *ix1 = STBTT_iceil ( x1 * scale_x + shift_x);
      if (iy1) *iy1 = STBTT_iceil (-y0 * scale_y + shift_y);
   }
}